

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ConfigUseClauseSyntax * __thiscall slang::parsing::Parser::parseConfigUseClause(Parser *this)

{
  bool bVar1;
  ConfigCellIdentifierSyntax *name;
  ParameterValueAssignmentSyntax *paramAssignments;
  SyntaxNode *pSVar2;
  ConfigUseClauseSyntax *pCVar3;
  Token use;
  SourceRange SVar4;
  Token local_48;
  Token local_38;
  
  use = ParserBase::expect(&this->super_ParserBase,UseKeyword);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Identifier);
  if (!bVar1) {
    bVar1 = ParserBase::peek(&this->super_ParserBase,Hash);
    if (bVar1) {
      name = (ConfigCellIdentifierSyntax *)0x0;
      goto LAB_00375460;
    }
  }
  name = parseConfigCellIdentifier(this);
LAB_00375460:
  paramAssignments = parseParameterValueAssignment(this);
  if ((paramAssignments != (ParameterValueAssignmentSyntax *)0x0) &&
     ((paramAssignments->parameters).elements._M_extent._M_extent_value != 0)) {
    pSVar2 = slang::syntax::TokenOrSyntax::node((paramAssignments->parameters).elements._M_ptr);
    if (pSVar2->kind == OrderedParamAssignment) {
      pSVar2 = slang::syntax::TokenOrSyntax::node((paramAssignments->parameters).elements._M_ptr);
      SVar4 = slang::syntax::SyntaxNode::sourceRange(pSVar2);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xc0005,SVar4);
    }
  }
  Token::Token(&local_38);
  Token::Token(&local_48);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Colon);
  if (bVar1) {
    local_38 = ParserBase::consume(&this->super_ParserBase);
    local_48 = ParserBase::expect(&this->super_ParserBase,ConfigKeyword);
    if (((undefined1  [16])local_48 & (undefined1  [16])0x10000) == (undefined1  [16])0x0 &&
        name == (ConfigCellIdentifierSyntax *)0x0) {
      SVar4 = Token::range(&local_48);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa0005,SVar4);
    }
  }
  pCVar3 = slang::syntax::SyntaxFactory::configUseClause
                     (&this->factory,use,name,paramAssignments,local_38,local_48);
  return pCVar3;
}

Assistant:

ConfigUseClauseSyntax& Parser::parseConfigUseClause() {
    auto use = expect(TokenKind::UseKeyword);

    ConfigCellIdentifierSyntax* name = nullptr;
    if (peek(TokenKind::Identifier) || !peek(TokenKind::Hash))
        name = &parseConfigCellIdentifier();

    auto paramAssignments = parseParameterValueAssignment();
    if (paramAssignments && !paramAssignments->parameters.empty() &&
        paramAssignments->parameters[0]->kind == SyntaxKind::OrderedParamAssignment) {
        addDiag(diag::ConfigParamsOrdered, paramAssignments->parameters[0]->sourceRange());
    }

    Token colon, config;
    if (peek(TokenKind::Colon)) {
        colon = consume();
        config = expect(TokenKind::ConfigKeyword);

        if (!name && !config.isMissing())
            addDiag(diag::ConfigMissingName, config.range());
    }

    return factory.configUseClause(use, name, paramAssignments, colon, config);
}